

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O1

void CB_EXPLORE::output_example(vw *all,cb_explore *data,example *ec,label *ld)

{
  v_array<char> *pvVar1;
  int iVar2;
  wclass *pwVar3;
  wclass *pwVar4;
  shared_data *this;
  int *piVar5;
  _func_void_int_string_v_array<char> *p_Var6;
  v_array<char> vVar7;
  cb_class *pcVar8;
  action_score *paVar9;
  size_t sVar10;
  long lVar11;
  wclass *cl;
  wclass *pwVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  int *piVar16;
  bool bVar17;
  float extraout_XMM0_Da;
  undefined4 uVar18;
  float fVar19;
  float loss;
  char temp_str [20];
  stringstream ss;
  stringstream sso;
  undefined4 in_stack_fffffffffffffc68;
  example *ec_00;
  undefined1 *local_378;
  undefined1 local_368 [16];
  char local_358 [24];
  stringstream local_340 [16];
  undefined1 local_330 [376];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  pcVar8 = GEN_CS::get_observed_cost(ld);
  (data->cbcs).known_cost = pcVar8;
  loss = 0.0;
  if (pcVar8 != (cb_class *)0x0) {
    paVar9 = (ec->pred).a_s._begin;
    lVar11 = (long)(ec->pred).scalars._end - (long)paVar9;
    if (lVar11 != 0) {
      pwVar3 = (data->cbcs).pred_scores.costs._begin;
      pwVar4 = (data->cbcs).pred_scores.costs._end;
      uVar13 = 0;
      fVar19 = extraout_XMM0_Da;
      do {
        uVar14 = (int)uVar13 + 1;
        bVar17 = pwVar3 == pwVar4;
        if (pwVar3 != pwVar4) {
          bVar17 = false;
          pwVar12 = pwVar3;
          do {
            if (pwVar12->class_index == uVar14) {
              fVar19 = 0.0;
              if (pcVar8->action == uVar14) {
                fVar19 = (pcVar8->cost - pwVar12->x) / pcVar8->probability;
              }
              fVar19 = pwVar12->x + fVar19;
            }
            if (pwVar12->class_index == uVar14) break;
            pwVar12 = pwVar12 + 1;
            bVar17 = pwVar12 == pwVar4;
          } while (!bVar17);
        }
        if ((bVar17) && (fVar19 = 0.0, pcVar8->action == uVar14)) {
          fVar19 = pcVar8->cost / pcVar8->probability;
        }
        fVar19 = fVar19 * paVar9[uVar13].score;
        loss = loss + fVar19;
        uVar13 = (ulong)uVar14;
      } while (uVar13 < (ulong)(lVar11 >> 3));
    }
  }
  this = all->sd;
  bVar17 = ec->test_only;
  ec_00 = ec;
  pcVar8 = GEN_CS::get_observed_cost(ld);
  shared_data::update(this,bVar17,pcVar8 != (cb_class *)0x0,loss,1.0,ec->num_features);
  std::__cxx11::stringstream::stringstream(local_340);
  std::__cxx11::stringstream::stringstream(local_1b8);
  paVar9 = (ec->pred).a_s._begin;
  if ((action_score *)(ec->pred).scalars._end == paVar9) {
    uVar14 = 0;
    uVar18 = 0;
  }
  else {
    fVar19 = 0.0;
    uVar13 = 0;
    uVar15 = 1;
    uVar14 = 0;
    do {
      sprintf(local_358,"%f ",SUB84((double)paVar9[uVar13].score,0));
      sVar10 = strlen(local_358);
      loss = fVar19;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,local_358,sVar10);
      paVar9 = (ec->pred).a_s._begin;
      fVar19 = paVar9[uVar13].score;
      if (loss < fVar19) {
        uVar14 = uVar15;
      }
      if (fVar19 <= loss) {
        fVar19 = loss;
      }
      uVar13 = (ulong)uVar15;
      uVar15 = uVar15 + 1;
    } while (uVar13 < (ulong)((long)(ec->pred).scalars._end - (long)paVar9 >> 3));
    uVar18 = SUB84((double)fVar19,0);
  }
  sprintf(local_358,"%d:%f",uVar18,(ulong)uVar14);
  sVar10 = strlen(local_358);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_358,sVar10);
  piVar16 = (all->final_prediction_sink)._begin;
  piVar5 = (all->final_prediction_sink)._end;
  if (piVar16 != piVar5) {
    pvVar1 = &ec_00->tag;
    do {
      iVar2 = *piVar16;
      p_Var6 = all->print_text;
      std::__cxx11::stringbuf::str();
      vVar7._begin._4_4_ = loss;
      vVar7._begin._0_4_ = in_stack_fffffffffffffc68;
      vVar7._end = (char *)all;
      vVar7.end_array = (char *)ec_00;
      vVar7.erase_count = (size_t)ld;
      (*p_Var6)(iVar2,(string)*pvVar1,vVar7);
      if (local_378 != local_368) {
        operator_delete(local_378);
      }
      piVar16 = piVar16 + 1;
    } while (piVar16 != piVar5);
  }
  bVar17 = (bool)(*(code *)PTR_test_label_002ee318)(ld);
  print_update_cb_explore(all,bVar17,ec_00,(stringstream *)local_1b8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base((ios_base *)(local_330 + 0x70));
  return;
}

Assistant:

void output_example(vw& all, cb_explore& data, example& ec, CB::label& ld)
{
  float loss = 0.;

  cb_to_cs& c = data.cbcs;

  if ((c.known_cost = get_observed_cost(ld)) != nullptr)
    for (uint32_t i = 0; i < ec.pred.a_s.size(); i++)
      loss += get_unbiased_cost(c.known_cost, c.pred_scores, i+1) * ec.pred.a_s[i].score;

  all.sd->update(ec.test_only, get_observed_cost(ld) != nullptr, loss, 1.f, ec.num_features);

  char temp_str[20];
  stringstream ss, sso;
  float maxprob = 0.;
  uint32_t maxid = 0;
  for (uint32_t i = 0; i < ec.pred.a_s.size(); i++)
  {
    sprintf(temp_str, "%f ", ec.pred.a_s[i].score);
    ss << temp_str;
    if (ec.pred.a_s[i].score > maxprob)
    {
      maxprob = ec.pred.a_s[i].score;
      maxid = i + 1;
    }
  }

  sprintf(temp_str, "%d:%f", maxid, maxprob);
  sso << temp_str;

  for (int sink : all.final_prediction_sink) all.print_text(sink, ss.str(), ec.tag);

  print_update_cb_explore(all, CB::cb_label.test_label(&ld), ec, sso);
}